

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::LowerProfiledStElemI(Lowerer *this,JitProfilingInstr *instr,PropertyOperationFlags flags)

{
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  undefined4 *puVar4;
  IntConstOpnd *pIVar5;
  AddrOpnd *opndArg;
  Opnd *pOVar6;
  IndirOpnd *this_00;
  Var address;
  RegOpnd *opndArg_00;
  HelperCallOpnd *newSrc;
  AddrOpnd *local_c0;
  Opnd *indexOpnd;
  IndirOpnd *indir;
  JnHelperMethod helper;
  Func *func;
  PropertyOperationFlags flags_local;
  JitProfilingInstr *instr_local;
  Lowerer *this_local;
  
  if (instr == (JitProfilingInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x235a,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  func_00 = (instr->super_Instr).m_func;
  if (flags == PropertyOperation_None) {
    indir._4_4_ = HelperProfiledStElem_DefaultFlags;
  }
  else {
    indir._4_4_ = HelperProfiledStElem;
    pIVar5 = IR::IntConstOpnd::New(0,TyInt8,func_00,false);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&pIVar5->super_Opnd);
    pIVar5 = IR::IntConstOpnd::New(0,TyInt8,func_00,false);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&pIVar5->super_Opnd);
    pIVar5 = IR::IntConstOpnd::New((long)(int)flags,TyInt32,func_00,true);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&pIVar5->super_Opnd);
  }
  pIVar5 = IR::Opnd::CreateProfileIdOpnd(instr->profileId,func_00);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&pIVar5->super_Opnd);
  opndArg = CreateFunctionBodyOpnd(this,func_00);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&opndArg->super_Opnd);
  pOVar6 = IR::Instr::UnlinkSrc1(&instr->super_Instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,pOVar6);
  pOVar6 = IR::Instr::UnlinkDst(&instr->super_Instr);
  this_00 = IR::Opnd::AsIndirOpnd(pOVar6);
  local_c0 = (AddrOpnd *)IR::IndirOpnd::UnlinkIndexOpnd(this_00);
  if (local_c0 == (AddrOpnd *)0x0) {
    iVar3 = IR::IndirOpnd::GetOffset(this_00);
    if (-1 < iVar3) {
      iVar3 = IR::IndirOpnd::GetOffset(this_00);
      bVar2 = Js::TaggedInt::IsOverflow(iVar3);
      if (!bVar2) goto LAB_007c82db;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x237b,
                       "(indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset()))"
                       ,
                       "indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset())"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
LAB_007c82db:
  if (local_c0 == (AddrOpnd *)0x0) {
    iVar3 = IR::IndirOpnd::GetOffset(this_00);
    address = Js::TaggedInt::ToVarUnchecked(iVar3);
    local_c0 = IR::AddrOpnd::New(address,AddrOpndKindDynamicVar,func_00,false,(Var)0x0);
  }
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&local_c0->super_Opnd);
  opndArg_00 = IR::IndirOpnd::UnlinkBaseOpnd(this_00);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,&instr->super_Instr,&opndArg_00->super_Opnd);
  IR::Opnd::Free(&this_00->super_Opnd,func_00);
  newSrc = IR::HelperCallOpnd::New(indir._4_4_,func_00);
  IR::Instr::SetSrc1(&instr->super_Instr,&newSrc->super_Opnd);
  LowererMD::LowerCall(&this->m_lowererMD,&instr->super_Instr,0);
  return;
}

Assistant:

void Lowerer::LowerProfiledStElemI(IR::JitProfilingInstr *const instr, const Js::PropertyOperationFlags flags)
{
    Assert(instr);

    /*
        void ProfilingHelpers::ProfiledStElem(
            const Var base,
            const Var varIndex,
            const Var value,
            FunctionBody *const functionBody,
            const ProfileId profileId,
            const PropertyOperationFlags flags,
            bool didArrayAccessHelperCall,
            bool bailedOutOnArraySpecialization)
    */

    Func *const func = instr->m_func;

    IR::JnHelperMethod helper;
    if(flags == Js::PropertyOperation_None)
    {
        helper = IR::HelperProfiledStElem_DefaultFlags;
    }
    else
    {
        helper = IR::HelperProfiledStElem;
        m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New(false, TyInt8, func));
        m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New(false, TyInt8, func));
        m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New(flags, TyInt32, func, true));
    }
    m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(instr->profileId, func));
    m_lowererMD.LoadHelperArgument(instr, CreateFunctionBodyOpnd(func));
    m_lowererMD.LoadHelperArgument(instr, instr->UnlinkSrc1());
    IR::IndirOpnd *const indir = instr->UnlinkDst()->AsIndirOpnd();
    IR::Opnd *const indexOpnd = indir->UnlinkIndexOpnd();
    Assert(indexOpnd || indir->GetOffset() >= 0 && !Js::TaggedInt::IsOverflow(indir->GetOffset()));
    m_lowererMD.LoadHelperArgument(
        instr,
        indexOpnd
            ? static_cast<IR::Opnd *>(indexOpnd)
            : IR::AddrOpnd::New(Js::TaggedInt::ToVarUnchecked(indir->GetOffset()), IR::AddrOpndKindDynamicVar, func));
    m_lowererMD.LoadHelperArgument(instr, indir->UnlinkBaseOpnd());
    indir->Free(func);

    instr->SetSrc1(IR::HelperCallOpnd::New(helper, func));
    m_lowererMD.LowerCall(instr, 0);
}